

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O2

Status __thiscall
leveldb::BuildTable(leveldb *this,string *dbname,Env *env,Options *options,TableCache *table_cache,
                   Iterator *iter,FileMetaData *meta)

{
  char *pcVar1;
  int iVar2;
  TableBuilder *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint64_t uVar3;
  Iterator *pIVar4;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  char *__tmp;
  char *pcVar5;
  char *pcVar6;
  Slice key;
  WritableFile *file;
  Env *local_78;
  TableCache *local_70;
  Status local_68;
  Slice local_60;
  string fname;
  
  *(undefined8 *)this = 0;
  meta->file_size = 0;
  local_78 = env;
  local_70 = table_cache;
  (*iter->_vptr_Iterator[3])(iter);
  TableFileName(&fname,dbname,meta->number);
  iVar2 = (*iter->_vptr_Iterator[2])(iter);
  if ((char)iVar2 == '\0') {
    pcVar5 = (char *)0x0;
  }
  else {
    (*local_78->_vptr_Env[4])(&key,local_78,&fname,&file);
    pcVar5 = key.data_;
    *(char **)this = key.data_;
    key.data_ = (char *)0x0;
    Status::~Status((Status *)&key);
    if (pcVar5 != (char *)0x0) goto LAB_0011e7e3;
    this_00 = (TableBuilder *)operator_new(8);
    TableBuilder::TableBuilder(this_00,options,file);
    iVar2 = (*iter->_vptr_Iterator[8])(iter);
    key.data_ = (char *)CONCAT44(extraout_var,iVar2);
    key.size_ = extraout_RDX;
    InternalKey::DecodeFrom(&meta->smallest,&key);
    while (iVar2 = (*iter->_vptr_Iterator[2])(iter), (char)iVar2 != '\0') {
      iVar2 = (*iter->_vptr_Iterator[8])(iter);
      key.data_ = (char *)CONCAT44(extraout_var_00,iVar2);
      key.size_ = extraout_RDX_00;
      InternalKey::DecodeFrom(&meta->largest,&key);
      iVar2 = (*iter->_vptr_Iterator[9])(iter);
      local_60.data_ = (char *)CONCAT44(extraout_var_01,iVar2);
      TableBuilder::Add(this_00,&key,&local_60);
      (*iter->_vptr_Iterator[6])(iter);
    }
    TableBuilder::Finish((TableBuilder *)&key);
    pcVar5 = key.data_;
    *(char **)this = key.data_;
    key.data_ = (char *)0x0;
    Status::~Status((Status *)&key);
    if (pcVar5 == (char *)0x0) {
      uVar3 = TableBuilder::FileSize(this_00);
      meta->file_size = uVar3;
      if (uVar3 == 0) {
        __assert_fail("meta->file_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/builder.cc"
                      ,0x2b,
                      "Status leveldb::BuildTable(const std::string &, Env *, const Options &, TableCache *, Iterator *, FileMetaData *)"
                     );
      }
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00);
      (*file->_vptr_WritableFile[5])(&key);
      pcVar5 = key.data_;
      *(char **)this = key.data_;
      key.data_ = (char *)0x0;
      Status::~Status((Status *)&key);
      if (pcVar5 == (char *)0x0) {
        (*file->_vptr_WritableFile[3])(&key);
        pcVar5 = key.data_;
        *(char **)this = key.data_;
        key.data_ = (char *)0x0;
        Status::~Status((Status *)&key);
      }
    }
    else {
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00);
    }
    if (file != (WritableFile *)0x0) {
      (*file->_vptr_WritableFile[1])();
    }
    file = (WritableFile *)0x0;
    if (pcVar5 == (char *)0x0) {
      key.size_ = 0;
      key.data_ = (char *)0x100;
      pIVar4 = TableCache::NewIterator
                         (local_70,(ReadOptions *)&key,meta->number,meta->file_size,(Table **)0x0);
      (*pIVar4->_vptr_Iterator[10])(&key,pIVar4);
      pcVar5 = key.data_;
      *(char **)this = key.data_;
      key.data_ = (char *)0x0;
      Status::~Status((Status *)&key);
      (*pIVar4->_vptr_Iterator[1])(pIVar4);
    }
  }
  (*iter->_vptr_Iterator[10])(&key,iter);
  pcVar1 = key.data_;
  Status::~Status((Status *)&key);
  pcVar6 = pcVar5;
  if (pcVar1 != (char *)0x0) {
    (*iter->_vptr_Iterator[10])(&key,iter);
    pcVar6 = key.data_;
    *(char **)this = key.data_;
    key.data_ = pcVar5;
    Status::~Status((Status *)&key);
  }
  if ((pcVar6 != (char *)0x0) || (meta->file_size == 0)) {
    (*local_78->_vptr_Env[8])(&local_68,local_78,&fname);
    Status::~Status(&local_68);
  }
LAB_0011e7e3:
  std::__cxx11::string::~string((string *)&fname);
  return (Status)(char *)this;
}

Assistant:

Status BuildTable(const std::string& dbname, Env* env, const Options& options,
                  TableCache* table_cache, Iterator* iter, FileMetaData* meta) {
  Status s;
  meta->file_size = 0;
  iter->SeekToFirst();

  std::string fname = TableFileName(dbname, meta->number);
  if (iter->Valid()) {
    WritableFile* file;
    s = env->NewWritableFile(fname, &file);
    if (!s.ok()) {
      return s;
    }

    TableBuilder* builder = new TableBuilder(options, file);
    meta->smallest.DecodeFrom(iter->key());
    for (; iter->Valid(); iter->Next()) {
      Slice key = iter->key();
      meta->largest.DecodeFrom(key);
      builder->Add(key, iter->value());
    }

    // Finish and check for builder errors
    s = builder->Finish();
    if (s.ok()) {
      meta->file_size = builder->FileSize();
      assert(meta->file_size > 0);
    }
    delete builder;

    // Finish and check for file errors
    if (s.ok()) {
      s = file->Sync();
    }
    if (s.ok()) {
      s = file->Close();
    }
    delete file;
    file = nullptr;

    if (s.ok()) {
      // Verify that the table is usable
      Iterator* it = table_cache->NewIterator(ReadOptions(), meta->number,
                                              meta->file_size);
      s = it->status();
      delete it;
    }
  }

  // Check for input iterator errors
  if (!iter->status().ok()) {
    s = iter->status();
  }

  if (s.ok() && meta->file_size > 0) {
    // Keep it
  } else {
    env->DeleteFile(fname);
  }
  return s;
}